

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall
QGraphicsView::drawItems
          (QGraphicsView *this,QPainter *painter,int numItems,QGraphicsItem **items,
          QStyleOptionGraphicsItem *options)

{
  bool bVar1;
  undefined1 *puVar2;
  QWidget *pQVar3;
  QGraphicsScene *pQVar4;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  QWidget *widget;
  QGraphicsViewPrivate *d;
  QAbstractScrollArea *in_stack_ffffffffffffffa0;
  QPaintDevice *local_48;
  
  d_func((QGraphicsView *)0xa409af);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa409c5);
  if (bVar1) {
    puVar2 = (undefined1 *)QPainter::device();
    pQVar3 = QAbstractScrollArea::viewport(in_stack_ffffffffffffffa0);
    local_48 = (QPaintDevice *)0x0;
    if (pQVar3 != (QWidget *)0x0) {
      local_48 = &pQVar3->super_QPaintDevice;
    }
    if ((QPaintDevice *)puVar2 == local_48) {
      pQVar3 = QAbstractScrollArea::viewport(in_stack_ffffffffffffffa0);
    }
    else {
      pQVar3 = (QWidget *)0x0;
    }
    pQVar4 = QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa40a4e);
    (**(code **)(*(long *)pQVar4 + 0xf8))(pQVar4,in_RSI,in_EDX,in_RCX,in_R8,pQVar3);
  }
  return;
}

Assistant:

void QGraphicsView::drawItems(QPainter *painter, int numItems,
                              QGraphicsItem *items[],
                              const QStyleOptionGraphicsItem options[])
{
    Q_D(QGraphicsView);
    if (d->scene) {
        QWidget *widget = painter->device() == viewport() ? viewport() : nullptr;
        d->scene->drawItems(painter, numItems, items, options, widget);
    }
}